

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader15.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::NodeLoader15::begin__instance_material____instance_material_type
          (NodeLoader15 *this,
          instance_material____instance_material_type__AttributeData *attributeData)

{
  long *plVar1;
  byte bVar2;
  uint *in_RSI;
  URI *in_RDI;
  instance_material__AttributeData attrData;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  uint local_118 [2];
  undefined8 local_110;
  undefined8 local_20;
  undefined8 local_18;
  uint *local_10;
  
  local_10 = in_RSI;
  instance_material__AttributeData::instance_material__AttributeData
            ((instance_material__AttributeData *)0xbba60e);
  local_118[0] = 0;
  local_20 = *(undefined8 *)(local_10 + 0x3e);
  local_110 = *(undefined8 *)(local_10 + 2);
  local_18 = *(undefined8 *)(local_10 + 0x40);
  if ((*local_10 & 1) == 1) {
    COLLADABU::URI::operator=
              (in_RDI,(URI *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
    local_118[0] = local_118[0] | 1;
  }
  plVar1 = *(long **)((long)&(in_RDI->mUriString).field_2 + 8);
  bVar2 = (**(code **)(*plVar1 + 0xe0))(plVar1,local_118);
  instance_material__AttributeData::~instance_material__AttributeData
            ((instance_material__AttributeData *)0xbba6d0);
  return (bool)(bVar2 & 1);
}

Assistant:

bool NodeLoader15::begin__instance_material____instance_material_type( const COLLADASaxFWL15::instance_material____instance_material_type__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__instance_material____instance_material_type(attributeData));
COLLADASaxFWL::instance_material__AttributeData attrData;
attrData.present_attributes = 0;
attrData.sid = attributeData.sid;
attrData.symbol = attributeData.symbol;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL15::instance_material____instance_material_type__AttributeData::ATTRIBUTE_TARGET_PRESENT) == COLLADASaxFWL15::instance_material____instance_material_type__AttributeData::ATTRIBUTE_TARGET_PRESENT ) {
    attrData.target = attributeData.target;
    attrData.present_attributes |= COLLADASaxFWL::instance_material__AttributeData::ATTRIBUTE_TARGET_PRESENT;
}
return mLoader->begin__instance_material(attrData);
}